

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O1

chunk_conflict * desert_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  int iVar1;
  short sVar2;
  short sVar3;
  _Bool _Var4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  wchar_t wVar10;
  chunk *c;
  feature *pfVar11;
  wchar_t *pwVar12;
  loc lVar13;
  loc_conflict lVar14;
  int iVar15;
  int iVar16;
  char **ppcVar17;
  wchar_t wVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  long local_88;
  int local_80;
  ulong local_78;
  loc_conflict local_60;
  wchar_t form_feats [7];
  
  wVar18 = (wchar_t)p->place;
  sVar2 = p->last_place;
  sVar3 = p->depth;
  form_feats[0] = FEAT_GRASS;
  form_feats[1] = FEAT_PASS_RUBBLE;
  form_feats[2] = FEAT_MAGMA;
  form_feats[3] = FEAT_GRANITE;
  form_feats[4] = FEAT_DUNE;
  form_feats[5] = FEAT_QUARTZ;
  form_feats[6] = FEAT_NONE;
  ppcVar17 = p_error;
  local_60 = loc(0,0);
  wVar10 = (wchar_t)ppcVar17;
  local_78 = (ulong)local_60 >> 0x20;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = wVar18;
  if (L'\0' < c->height) {
    lVar23 = 0;
    lVar24 = 0;
    do {
      if (L'\0' < c->width) {
        lVar21 = 0;
        do {
          square_set_feat((chunk_conflict *)c,(loc)(lVar23 + lVar21),FEAT_GRASS);
          lVar21 = lVar21 + 1;
        } while (lVar21 < c->width);
      }
      lVar24 = lVar24 + 1;
      wVar10 = L'\0';
      lVar23 = lVar23 + 0x100000000;
    } while (lVar24 < c->height);
  }
  iVar5 = sVar3 * 0x14;
  alloc_paths((chunk_conflict *)c,(player *)(ulong)(uint)wVar18,(int)sVar2,wVar10);
  set_num_vaults((chunk_conflict *)c);
  iVar20 = 0;
  make_edges((chunk_conflict *)c,true,false);
  if (world->levels[wVar18].down != (char *)0x0) {
    num_wild_vaults = L'\0';
    if (L'\0' < c->width) {
      local_88 = 0;
      uVar19 = 0;
      do {
        if (uVar19 != 0) {
          uVar25 = uVar19 & 0xffffffff;
          lVar23 = 0;
          lVar24 = 0;
          do {
            lVar13 = (loc)(lVar23 + uVar25);
            _Var4 = square_in_bounds_fully((chunk_conflict *)c,lVar13);
            if (_Var4) {
              pfVar11 = square_feat((chunk_conflict *)c,lVar13);
              if (pfVar11->fidx == FEAT_ROAD) {
                local_78 = -lVar24;
                local_60 = (loc_conflict)(lVar24 - local_88);
                square_set_feat((chunk_conflict *)c,(loc)(lVar23 + uVar25),FEAT_MORE);
                wVar10 = level_topography((int)sVar2);
                if ((wVar10 == L'\a') || (turn < 10)) {
                  player_place((chunk_conflict2 *)c,p,(loc_conflict)(lVar23 + uVar25));
                }
                break;
              }
              square_set_feat((chunk_conflict *)c,lVar13,FEAT_GRANITE);
            }
            lVar24 = lVar24 + -1;
            lVar23 = lVar23 + 0x100000000;
            uVar25 = (ulong)((int)uVar25 - 1);
          } while (local_88 != lVar24);
        }
        if ((int)local_78 != 0) break;
        uVar19 = uVar19 + 1;
        local_88 = local_88 + -1;
        local_78 = 0;
      } while ((long)uVar19 < (long)c->width);
      iVar20 = (int)uVar19;
    }
    iVar15 = c->height * c->width;
    iVar5 = (int)((iVar15 - ((uint)(iVar20 * iVar20) >> 1)) * iVar5) / iVar15;
  }
  if (L'\0' < c->height) {
    lVar24 = 0;
    lVar23 = 0;
    do {
      if (L'\0' < c->width) {
        lVar21 = 0;
        do {
          lVar13 = (loc)(lVar24 + lVar21);
          pfVar11 = square_feat((chunk_conflict *)c,lVar13);
          if (pfVar11->fidx == FEAT_GRASS) {
            uVar6 = Rand_div(2);
            if (uVar6 == 0) {
              pwVar12 = &FEAT_DUNE;
LAB_0015e06a:
              wVar10 = *pwVar12;
            }
            else {
              uVar6 = Rand_div(2);
              wVar10 = FEAT_MAGMA;
              if (uVar6 == 0) {
                pwVar12 = &FEAT_PASS_RUBBLE;
                goto LAB_0015e06a;
              }
            }
            square_set_feat((chunk_conflict *)c,lVar13,wVar10);
          }
          else {
            square_mark((chunk_conflict *)c,lVar13);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < c->width);
      }
      lVar23 = lVar23 + 1;
      lVar24 = lVar24 + 0x100000000;
    } while (lVar23 < c->height);
  }
  local_80 = rand_range(2,4);
  iVar20 = 0x31;
  do {
    uVar6 = Rand_div(6);
    iVar15 = uVar6 + 4;
    uVar7 = Rand_div(5);
    iVar1 = uVar7 + 4;
    iVar9 = 7;
    if (7 < iVar1) {
      iVar9 = iVar1;
    }
    iVar16 = (c->height - uVar7) + -5;
    iVar22 = c->height + L'\xfffffff8';
    if (iVar16 < iVar22) {
      iVar22 = iVar16;
    }
    iVar22 = rand_range(iVar9,iVar22);
    iVar9 = 10;
    if (10 < iVar15) {
      iVar9 = iVar15;
    }
    iVar8 = (c->width - uVar6) + -5;
    iVar16 = c->height + L'\xfffffff5';
    if (iVar8 < iVar16) {
      iVar16 = iVar8;
    }
    iVar9 = rand_range(iVar9,iVar16);
    lVar13 = (loc)loc(iVar9,iVar22);
    _Var4 = square_isgranite((chunk_conflict *)c,lVar13);
    if (_Var4) {
LAB_0015e175:
      bVar27 = false;
    }
    else {
      lVar14 = loc(iVar9,iVar22);
      wVar10 = distance(lVar14,(loc_conflict)((ulong)local_60 & 0xffffffff | local_78 << 0x20));
      if (wVar10 < iVar15 + iVar1) goto LAB_0015e175;
      _Var4 = generate_starburst_room
                        (c,iVar22 - iVar1,iVar9 - iVar15,iVar22 + iVar1,iVar9 + iVar15,false,
                         FEAT_GRASS,false);
      local_80 = local_80 - (uint)_Var4;
      bVar27 = local_80 == 0;
    }
    bVar26 = iVar20 == 0;
    iVar20 = iVar20 + -1;
    if ((bVar27) || (bVar26)) {
      if (0 < iVar5) {
        iVar20 = 0;
        do {
          uVar6 = Rand_div(c->height + L'\xfffffffe');
          uVar7 = Rand_div(c->width + L'\xfffffffe');
          lVar14.y = uVar6 + 1;
          lVar14.x = uVar7 + 1;
          wVar10 = make_formation((chunk_conflict *)c,p,lVar14,FEAT_RUBBLE,FEAT_MAGMA,form_feats,
                                  "Desert",c->depth);
          iVar20 = iVar20 + wVar10;
        } while (iVar20 < iVar5);
      }
      if (L'\0' < c->height) {
        lVar23 = 0;
        lVar24 = 0;
        do {
          if (L'\0' < c->width) {
            lVar21 = 0;
            do {
              square_unmark((chunk_conflict *)c,(loc)(lVar23 + lVar21));
              lVar21 = lVar21 + 1;
            } while (lVar21 < c->width);
          }
          lVar24 = lVar24 + 1;
          lVar23 = lVar23 + 0x100000000;
        } while (lVar24 < c->height);
      }
      populate((chunk_conflict *)c,false);
      _Var4 = verify_level((chunk_conflict *)c);
      if (!_Var4) {
        wipe_mon_list(c,p);
        cave_free((chunk_conflict *)c);
        *p_error = "wilderness level had generation issues";
        c = (chunk *)0x0;
      }
      return (chunk_conflict *)c;
    }
  } while( true );
}

Assistant:

struct chunk *desert_gen(struct player *p, int height, int width,
						 const char **p_error)
{
	bool made_plat;

	struct loc grid;
	int j, d = 0;
	int plats;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int form_grids_target = p->depth * 20;

	int form_feats[] = { FEAT_GRASS, FEAT_PASS_RUBBLE, FEAT_MAGMA, FEAT_GRANITE,
						 FEAT_DUNE, FEAT_QUARTZ, FEAT_NONE };
	struct loc stair = loc(0, 0);

    /* Make the level */
    struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass so paths work */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Place 2 or 3 paths to neighbouring places, place player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, true, false);

	/* Dungeon entrance */
	if (world->levels[place].down) {
		/* No vaults */
		num_wild_vaults = 0;

		/* Angband! */
		for (d = 0; d < c->width; d++) {
			for (grid.y = 0; grid.y < d; grid.y++) {
				grid.x = d - grid.y;
				if (!square_in_bounds_fully(c, grid))
					continue;
				if (square_feat(c, grid)->fidx == FEAT_ROAD) {
					/* The gate of Angband */
					square_set_feat(c, grid, FEAT_MORE);
					stair = grid;
					if (level_topography(last_place) == TOP_CAVE || turn < 10)
						player_place(c, p, grid);
					break;
				} else {
					/* The walls of Thangorodrim */
					square_set_feat(c, grid, FEAT_GRANITE);
				}
			}
			if (stair.y)
				break;
		}

		/* Adjust formation grids for how much of the level is removed */
		form_grids_target *= (c->width * c->height - (d * d / 2));
		form_grids_target /= (c->width * c->height);
	}

	/* Now place rubble, sand and magma */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create desert */
			if (square_feat(c, grid)->fidx == FEAT_GRASS) {
				if (one_in_(2))
					square_set_feat(c, grid, FEAT_DUNE);
				else if (one_in_(2))
					square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				else
					square_set_feat(c, grid, FEAT_MAGMA);
			} else
				/* Prepare for clearings */
				square_mark(c, grid);
		}
	}

	/* Make a few clearings */
	plats = rand_range(2, 4);

	/* Try fairly hard */
	for (j = 0; j < 50; j++) {
		int a, b, x, xlo, xhi, y, ylo, yhi;

		/*
		 * Try for a clearing.  Constrain the center choice so the
		 * bounding box is in bounds and the center won't be within
		 * the maximum possible extent of the walls created by
		 * make_edges() (that's to avoid a room that's entirely
		 * surrounded by those walls).
		 */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		ylo = MAX(b, 7);
		yhi = MIN(c->height - 1 - b, c->height - 8);
		y = rand_range(ylo, yhi);
		xlo = MAX(a, 10);
		xhi = MIN(c->width - 1 - a, c->height - 11);
		x = rand_range(xlo, xhi);
		if (square_isgranite(c, loc(x, y))) continue;
		if (distance(loc(x, y), stair) < a + b) continue;
		made_plat = generate_starburst_room(c, y - b, x - a, y + b, x + a,
											false, FEAT_GRASS, false);

		/* Success ? */
		if (made_plat)
			plats--;

		/* Done ? */
		if (!plats)
			break;
	}

	/* Place some formations */
	while (form_grids < form_grids_target) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_RUBBLE, FEAT_MAGMA,
									 form_feats, "Desert", c->depth);
	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}